

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_ManCountRemoved(Cof_Man_t *p,Cof_Obj_t *pRoot,int fConst1)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  uint *puVar10;
  long lVar11;
  uint *puVar12;
  Cof_Obj_t *pObj;
  int local_48;
  
  uVar2 = p->nTravIds + 1;
  p->nTravIds = uVar2;
  pRoot->Value = uVar2;
  iVar3 = Cof_ObjLevel(p,pRoot);
  piVar1 = p->pLevels;
  lVar11 = (long)iVar3;
  if (piVar1[lVar11] != 0) {
    __assert_fail("p->pLevels[LevelStart] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                  ,0x1c8,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
  }
  pRoot->iNext = 0;
  piVar1[lVar11] = (int)((ulong)((long)pRoot - (long)p->pObjData) >> 2);
  local_48 = 0;
  iVar3 = Abc_Var2Lit(0,fConst1);
  pRoot->iLit = iVar3;
  do {
    if (p->nLevels <= lVar11) {
      return local_48;
    }
    for (puVar10 = (uint *)(p->pLevels + lVar11); uVar8 = (ulong)*puVar10, uVar8 != 0;
        puVar10 = puVar10 + 4) {
      piVar1 = p->pObjData;
      iVar3 = piVar1[uVar8 + 3];
      iVar4 = Abc_Lit2Var(piVar1[uVar8 + 5]);
      if (iVar3 == iVar4) {
        __assert_fail("pTemp->Id != Abc_Lit2Var(pTemp->iLit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0x1d4,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
      }
      puVar10 = (uint *)(piVar1 + uVar8);
      uVar2 = 0;
      while( true ) {
        if (*puVar10 >> 8 <= uVar2) break;
        if (((puVar10[puVar10[(ulong)((*puVar10 >> 4 & 0xf) + uVar2) + 6] & 0x7fffffff] & 0xf1) !=
             0x11) &&
           (pObj = (Cof_Obj_t *)
                   (puVar10 + (puVar10[(ulong)((*puVar10 >> 4 & 0xf) + uVar2) + 6] & 0x7fffffff)),
           pObj->Value != p->nTravIds)) {
          puVar12 = (uint *)((long)pObj + ((ulong)*(uint *)(pObj + 1) & 0x7fffffff) * -4);
          puVar9 = (uint *)((long)pObj + ((ulong)pObj[1].nFanoutsM & 0x7fffffff) * -4);
          if ((puVar12 != puVar10) && (puVar9 != puVar10)) {
            __assert_fail("pFanin0 == pTemp || pFanin1 == pTemp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                          ,0x1dd,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
          }
          pGVar6 = Gia_ManObj(p->pGia,pObj->Id);
          if (puVar12[2] == p->nTravIds) {
            iVar3 = Abc_LitNotCond(puVar12[5],*(uint *)pGVar6 >> 0x1d & 1);
          }
          else {
            iVar3 = Abc_Var2Lit(pObj->Id - (*(uint *)pGVar6 & 0x1fffffff),
                                *(uint *)pGVar6 >> 0x1d & 1);
          }
          if (puVar9[2] == p->nTravIds) {
            iVar4 = Abc_LitNotCond(puVar9[5],(uint)((ulong)*(undefined8 *)pGVar6 >> 0x3d) & 1);
          }
          else {
            uVar5 = (uint)((ulong)*(undefined8 *)pGVar6 >> 0x20);
            iVar4 = Abc_Var2Lit(pObj->Id - (uVar5 & 0x1fffffff),uVar5 >> 0x1d & 1);
          }
          iVar3 = Gia_ManHashAndTry(p->pGia,iVar3,iVar4);
          if (iVar3 != -1) {
            pObj->Value = p->nTravIds;
            pObj->iLit = iVar3;
            iVar3 = Cof_ObjLevel(p,pObj);
            lVar7 = (long)iVar3;
            if ((lVar7 <= lVar11) || (p->nLevels <= iVar3)) {
              __assert_fail("LevelNext > i && LevelNext < p->nLevels",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                            ,0x1ef,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
            }
            piVar1 = p->pLevels;
            pObj->iNext = piVar1[lVar7];
            piVar1[lVar7] = (int)((ulong)((long)pObj - (long)p->pObjData) >> 2);
            local_48 = local_48 + 1;
          }
        }
        uVar2 = uVar2 + 1;
      }
    }
    p->pLevels[lVar11] = 0;
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int Cof_ManCountRemoved( Cof_Man_t * p, Cof_Obj_t * pRoot, int fConst1 )
{
    Gia_Obj_t * pNextGia;
    Cof_Obj_t * pTemp, * pNext, * pFanin0, * pFanin1;
    int Counter = 0, LevelStart, LevelNext;
    int i, k, iHandle, iLit0, iLit1, iNextNew;
    // restart the trav ids
    Cof_ManIncrementTravId( p );
    Cof_ObjSetTravIdCurrent( p, pRoot );
    // add the node to the queue
    LevelStart = Cof_ObjLevel(p, pRoot);
    assert( p->pLevels[LevelStart] == 0 );
    pRoot->iNext = 0;
    p->pLevels[LevelStart] = Cof_ObjHandle( p, pRoot );
    // set the new literal
    pRoot->iLit = Abc_Var2Lit( 0, fConst1 );
    // process nodes in the levelized order
    for ( i = LevelStart; i < p->nLevels; i++ )
    {
        for ( iHandle = p->pLevels[i]; 
              iHandle && (pTemp = Cof_ManObj(p, iHandle)); 
              iHandle = pTemp->iNext )
        {
            assert( pTemp->Id != Abc_Lit2Var(pTemp->iLit) );
            Cof_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( Cof_ObjIsCo(pNext) )
                    continue;
                if ( Cof_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                pFanin0 = Cof_ObjFanin( pNext, 0 );
                pFanin1 = Cof_ObjFanin( pNext, 1 );
                assert( pFanin0 == pTemp || pFanin1 == pTemp );
                pNextGia = Gia_ManObj( p->pGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin0) )
                    iLit0 = Abc_LitNotCond( pFanin0->iLit, Gia_ObjFaninC0(pNextGia) );
                else
                    iLit0 = Gia_ObjFaninLit0( pNextGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin1) )
                    iLit1 = Abc_LitNotCond( pFanin1->iLit, Gia_ObjFaninC1(pNextGia) );
                else
                    iLit1 = Gia_ObjFaninLit1( pNextGia, pNext->Id );
                iNextNew = Gia_ManHashAndTry( p->pGia, iLit0, iLit1 );
                if ( iNextNew == -1 )
                    continue;
                Cof_ObjSetTravIdCurrent(p, pNext);
                // set the new literal
                pNext->iLit = iNextNew;
                // add it to be processed
                LevelNext = Cof_ObjLevel( p, pNext );
                assert( LevelNext > i && LevelNext < p->nLevels );
                pNext->iNext = p->pLevels[LevelNext];
                p->pLevels[LevelNext] = Cof_ObjHandle( p, pNext );
                Counter++;
            }
        }
        p->pLevels[i] = 0;
    }
    return Counter;
}